

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DDLNodeTest.cpp
# Opt level: O2

void __thiscall
ODDLParser::DDLNodeTest_accessValueTest_Test::~DDLNodeTest_accessValueTest_Test
          (DDLNodeTest_accessValueTest_Test *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST_F(DDLNodeTest, accessValueTest) {
    DDLNode *myNode = DDLNode::create("test", "name");
    ASSERT_FALSE(nullptr == myNode);
    EXPECT_TRUE(nullptr == myNode->getValue());

    Value *myValue(new Value(Value::ValueType::ddl_bool));
    myNode->setValue(myValue);
    EXPECT_EQ(myValue, myNode->getValue());
    delete myNode;
}